

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSpriteAmiga __thiscall
DataSourceAmiga::decode_amiga_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t *palette)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  byte *pbVar5;
  byte *pbVar6;
  uint8_t *puVar7;
  long in_R9;
  size_t sVar8;
  bool bVar9;
  PSpriteAmiga PVar10;
  undefined1 local_39;
  unsigned_long local_38;
  uint8_t *local_30;
  
  local_38 = height * 8;
  local_30 = palette;
  std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<DataSourceAmiga::SpriteAmiga>,unsigned_long,unsigned_long&>
            ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<DataSourceAmiga::SpriteAmiga> *)&local_39,&local_38,
             (unsigned_long *)&local_30);
  _Var4._M_pi = extraout_RDX;
  if (local_30 != (uint8_t *)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[7];
    pbVar5 = *(byte **)(*(long *)width + 0x18);
    pbVar6 = pbVar5 + height * (long)local_30 * 2;
    puVar7 = (uint8_t *)0x0;
    do {
      if (height != 0) {
        sVar8 = 0;
        do {
          uVar3 = 7;
          do {
            bVar2 = (byte)uVar3;
            lVar1 = (ulong)((uint)((*pbVar5 >> (uVar3 & 0x1f) & 1) != 0) +
                            (pbVar5[height] >> (bVar2 & 0x1f) & 1) * 2 +
                            (*pbVar6 >> (bVar2 & 0x1f) & 1) * 4 +
                           (pbVar6[height] >> (bVar2 & 0x1f) & 1) * 8) * 3;
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 2) =
                 *(code *)(in_R9 + 0x30 + lVar1);
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 1) =
                 *(code *)(in_R9 + 0x31 + lVar1);
            *(code *)&(_Var4._M_pi)->_vptr__Sp_counted_base = *(code *)(in_R9 + 0x32 + lVar1);
            *(code *)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 3) = (code)0xff;
            _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + 4);
            bVar9 = uVar3 != 0;
            uVar3 = uVar3 - 1;
          } while (bVar9);
          pbVar5 = pbVar5 + 1;
          pbVar6 = pbVar6 + 1;
          sVar8 = sVar8 + 1;
        } while (sVar8 != height);
      }
      pbVar5 = pbVar5 + height;
      pbVar6 = pbVar6 + height;
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_30);
  }
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar10.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_amiga_sprite(PBuffer data, size_t width, size_t height,
                                     uint8_t *palette) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src_1 = reinterpret_cast<uint8_t*>(data->get_data());
  size_t bp2s = width * 2 * height;
  uint8_t *src_2 = src_1 + bp2s;
  Data::Sprite::Color *res = sprite->get_writable_data();

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        color |= (((*src_1) >> k) & 0x01) << 0;
        color |= (((*(src_1 + width)) >> k) & 0x01) << 1;
        color |= (((*src_2) >> k) & 0x01) << 2;
        color |= (((*(src_2 + width)) >> k) & 0x01) << 3;
        color |= 0x10;
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src_1++;
      src_2++;
    }
    src_1 += width;
    src_2 += width;
  }

  return sprite;
}